

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O3

bool __thiscall
ON_SubDMatrix::EvaluateSubdivisionPoint
          (ON_SubDMatrix *this,uint element_index,double *point_ring,size_t point_ring_count,
          size_t point_ring_stride,double *subd_point)

{
  double *pdVar1;
  double dVar2;
  double **ppdVar3;
  bool bVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  ppdVar3 = this->m_S;
  if (((ppdVar3 == (double **)0x0) || (this->m_R <= element_index)) ||
     (this->m_R != point_ring_count ||
      (point_ring == (double *)0x0 || (point_ring_stride < 3 || point_ring_count < 4)))) {
    ON_SubDIncrementErrorCount();
    bVar4 = false;
  }
  else {
    *subd_point = 0.0;
    subd_point[1] = 0.0;
    subd_point[2] = 0.0;
    pdVar5 = ppdVar3[element_index];
    pdVar1 = pdVar5 + point_ring_count;
    pdVar6 = point_ring + 2;
    dVar7 = 0.0;
    dVar8 = 0.0;
    dVar9 = 0.0;
    do {
      dVar2 = *pdVar5;
      pdVar5 = pdVar5 + 1;
      dVar9 = dVar9 + pdVar6[-2] * dVar2;
      *subd_point = dVar9;
      dVar8 = dVar8 + pdVar6[-1] * dVar2;
      subd_point[1] = dVar8;
      dVar7 = dVar7 + dVar2 * *pdVar6;
      subd_point[2] = dVar7;
      pdVar6 = pdVar6 + point_ring_stride;
    } while (pdVar5 < pdVar1);
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool ON_SubDMatrix::EvaluateSubdivisionPoint(
  unsigned int element_index,
  const double* point_ring,
  size_t point_ring_count,
  size_t point_ring_stride,
  double subd_point[3]
  ) const
{
  if ( nullptr == m_S || element_index >= m_R )
    return ON_SUBD_RETURN_ERROR(false);
  if (false == IsValidPointRing(point_ring,point_ring_count,point_ring_stride))
    return ON_SUBD_RETURN_ERROR(false);
 
  subd_point[0] = 0.0;
  subd_point[1] = 0.0;
  subd_point[2] = 0.0;
  double c;
  const double* s = m_S[element_index];
  const double* s1 = s + m_R;
  while (s < s1)
  {
    c = *s++;
    subd_point[0] += c*point_ring[0];
    subd_point[1] += c*point_ring[1];
    subd_point[2] += c*point_ring[2];
    point_ring += point_ring_stride;
  }

  return true;
}